

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O1

void __thiscall slang::IntervalMapDetails::Path::moveRight(Path *this,uint32_t level)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  
  uVar6 = (ulong)level;
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar7 = level;
  iVar2 = 0;
  do {
    iVar3 = iVar2;
    uVar5 = uVar7;
    if (uVar5 == 1) {
      uVar5 = 1;
      uVar7 = 0;
      break;
    }
    uVar7 = uVar5 - 1;
    iVar2 = iVar3 + 1;
  } while (pEVar1[uVar7].offset == pEVar1[uVar7].size - 1);
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar8 = pEVar1[uVar7].offset + 1;
  pEVar1[uVar7].offset = uVar8;
  if (uVar8 != pEVar1[uVar7].size) {
    uVar4 = *(ulong *)((long)pEVar1[uVar7].node + (ulong)uVar8 * 8);
    if (uVar5 == level) {
      uVar6 = (ulong)uVar5;
    }
    else {
      iVar3 = -iVar3;
      do {
        uVar5 = level + iVar3;
        pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
        pEVar1[uVar5].node = (ulong *)(uVar4 & 0xffffffffffffffc0);
        pEVar1[uVar5].size = ((uint)uVar4 & 0x3f) + 1;
        pEVar1[uVar5].offset = 0;
        uVar4 = *(ulong *)(uVar4 & 0xffffffffffffffc0);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
    }
    pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pEVar1[uVar6].node = (void *)(uVar4 & 0xffffffffffffffc0);
    pEVar1[uVar6].size = ((uint)uVar4 & 0x3f) + 1;
    pEVar1[uVar6].offset = 0;
  }
  return;
}

Assistant:

void Path::moveRight(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the end we've gone as far as we can.
    if (++path[l].offset == path[l].size)
        return;

    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, 0);
        nodeRef = nodeRef.childAt(0);
    }
    path[l] = Entry(nodeRef, 0);
}